

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab3_main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long local_260;
  ofstream out;
  ios_base local_168 [264];
  undefined1 local_60 [8];
  Interpreter i;
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage infile outfile.",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  else {
    std::ofstream::ofstream(&local_260);
    std::ofstream::open((char *)&local_260,(_Ios_Openmode)argv[2]);
    Interpreter::Interpreter((Interpreter *)local_60);
    Interpreter::run((Interpreter *)local_60,argv[1],(ostream *)&local_260,PROJ5);
    DatalogDatabase::~DatalogDatabase((DatalogDatabase *)local_60);
    local_260 = _VTT;
    *(undefined8 *)((long)&local_260 + *(long *)(_VTT + -0x18)) = __filebuf;
    std::filebuf::~filebuf((filebuf *)&out);
    std::ios_base::~ios_base(local_168);
  }
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
  if (argc < 3)
  {
    cout << "Usage infile outfile." << endl;
    return 0;
  }

  ofstream out;
  out.open(argv[2]);

  Interpreter i = Interpreter();
  i.run(argv[1], out, PROJ5);
}